

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minigzip.c
# Opt level: O0

void file_uncompress(char *file)

{
  int iVar1;
  size_t sVar2;
  gzFile in_00;
  FILE *out_00;
  uint len;
  gzFile in;
  FILE *out;
  char *outfile;
  char *infile;
  char buf [1024];
  char *file_local;
  
  sVar2 = strlen(file);
  if (0x3ff < (sVar2 & 0xffffffff) + 3) {
    fprintf(_stderr,"%s: filename too long\n",prog);
    exit(1);
  }
  snprintf((char *)&infile,0x400,"%s",file);
  if (3 < (uint)sVar2) {
    iVar1 = strcmp(file + ((sVar2 & 0xffffffff) - 3),".gz");
    if (iVar1 == 0) {
      out = (FILE *)&infile;
      *(undefined1 *)((long)&out->_flags + (ulong)((uint)sVar2 - 3)) = 0;
      outfile = file;
      goto LAB_00101692;
    }
  }
  outfile = (char *)&infile;
  snprintf(buf + ((sVar2 & 0xffffffff) - 8),0x400 - (sVar2 & 0xffffffff),"%s",".gz");
  out = (FILE *)file;
LAB_00101692:
  in_00 = (gzFile)gzopen64(outfile,"rb");
  if (in_00 == (gzFile)0x0) {
    fprintf(_stderr,"%s: can\'t gzopen %s\n",prog,outfile);
    exit(1);
  }
  out_00 = fopen64((char *)out,"wb");
  if (out_00 == (FILE *)0x0) {
    perror(file);
    exit(1);
  }
  gz_uncompress(in_00,(FILE *)out_00);
  unlink(outfile);
  return;
}

Assistant:

void file_uncompress(file)
    char  *file;
{
    local char buf[MAX_NAME_LEN];
    char *infile, *outfile;
    FILE  *out;
    gzFile in;
    unsigned len = strlen(file);

    if (len + strlen(GZ_SUFFIX) >= sizeof(buf)) {
        fprintf(stderr, "%s: filename too long\n", prog);
        exit(1);
    }

#if !defined(NO_snprintf) && !defined(NO_vsnprintf)
    snprintf(buf, sizeof(buf), "%s", file);
#else
    strcpy(buf, file);
#endif

    if (len > SUFFIX_LEN && strcmp(file+len-SUFFIX_LEN, GZ_SUFFIX) == 0) {
        infile = file;
        outfile = buf;
        outfile[len-3] = '\0';
    } else {
        outfile = file;
        infile = buf;
#if !defined(NO_snprintf) && !defined(NO_vsnprintf)
        snprintf(buf + len, sizeof(buf) - len, "%s", GZ_SUFFIX);
#else
        strcat(infile, GZ_SUFFIX);
#endif
    }
    in = gzopen(infile, "rb");
    if (in == NULL) {
        fprintf(stderr, "%s: can't gzopen %s\n", prog, infile);
        exit(1);
    }
    out = fopen(outfile, "wb");
    if (out == NULL) {
        perror(file);
        exit(1);
    }

    gz_uncompress(in, out);

    unlink(infile);
}